

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O2

Vec_Bit_t * Acec_MapXorIns(Gia_Man_t *p,Vec_Int_t *vXors)

{
  int iVar1;
  Vec_Bit_t *p_00;
  int Entry;
  int Entry_00;
  int Entry_01;
  int i;
  
  p_00 = Vec_BitStart(p->nObjs);
  for (i = 3; i + -3 < vXors->nSize; i = i + 4) {
    iVar1 = Vec_IntEntry(vXors,i + -2);
    Vec_BitWriteEntry(p_00,iVar1,Entry);
    iVar1 = Vec_IntEntry(vXors,i + -1);
    Vec_BitWriteEntry(p_00,iVar1,Entry_00);
    iVar1 = Vec_IntEntry(vXors,i);
    Vec_BitWriteEntry(p_00,iVar1,Entry_01);
  }
  return p_00;
}

Assistant:

Vec_Bit_t * Acec_MapXorIns( Gia_Man_t * p, Vec_Int_t * vXors )
{
    Vec_Bit_t * vMap = Vec_BitStart( Gia_ManObjNum(p) ); int i;
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
    {
        Vec_BitWriteEntry( vMap, Vec_IntEntry(vXors, 4*i+1), 1 );
        Vec_BitWriteEntry( vMap, Vec_IntEntry(vXors, 4*i+2), 1 );
        Vec_BitWriteEntry( vMap, Vec_IntEntry(vXors, 4*i+3), 1 );
    }
    return vMap;
}